

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O1

StateResult __thiscall
anon_unknown.dwarf_28c0::HashSeedStorage::initialize(HashSeedStorage *this,int which)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar4;
  StateResult SVar5;
  InitialRandomData IVar6;
  StateResult SVar7;
  quintptr local_38 [2];
  quintptr local_20;
  undefined8 extraout_RDX_00;
  
  local_20 = *(quintptr *)(in_FS_OFFSET + 0x28);
  __s = getenv("QT_HASH_SEED");
  if (__s == (char *)0x0) {
LAB_001df09b:
    local_38[1] = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_38[0] = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    IVar6 = qt_initial_random_value();
    local_38[0] = IVar6.data[0];
    local_38[1] = IVar6.data[1];
    lVar2 = 0;
    do {
      uVar3 = *(undefined8 *)((long)local_38 + lVar2);
      *(undefined8 *)
       ((long)&qt_qhash_seed.seeds[0]._q_value.super___atomic_base<unsigned_long_long>._M_i + lVar2)
           = uVar3;
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
  }
  else {
    sVar1 = strlen(__s);
    QVar4 = qstrntoll(__s,sVar1,10);
    if (QVar4.used < 1) goto LAB_001df09b;
    sVar1 = strlen(__s);
    if (QVar4.used != sVar1) goto LAB_001df09b;
    uVar3 = extraout_RDX;
    if (QVar4.result != 0) {
      if (*(quintptr *)(in_FS_OFFSET + 0x28) == local_20) {
        SVar5.requestedSeed =
             fwrite("QT_HASH_SEED: forced seed value is not 0; ignored.\n",0x33,1,_stderr);
        SVar5._8_8_ = extraout_RDX_00;
        return SVar5;
      }
      goto LAB_001df0e9;
    }
  }
  if (*(quintptr *)(in_FS_OFFSET + 0x28) == local_20) {
    SVar7._8_8_ = uVar3;
    SVar7.requestedSeed = *(quintptr *)(in_FS_OFFSET + 0x28);
    return SVar7;
  }
LAB_001df0e9:
  __stack_chk_fail();
}

Assistant:

[[maybe_unused]] HashSeedStorage::StateResult HashSeedStorage::initialize(int which) noexcept
{
    StateResult result = { 0, OverriddenByEnvironment };
#ifdef QT_BOOTSTRAPPED
    Q_UNUSED(which);
    Q_UNREACHABLE_RETURN(result);
#else
    // can't use qEnvironmentVariableIntValue (reentrancy)
    const char *seedstr = getenv("QT_HASH_SEED");
    if (seedstr) {
        auto r = qstrntoll(seedstr, strlen(seedstr), 10);
        if (r.used > 0 && size_t(r.used) == strlen(seedstr)) {
            if (r.result) {
                // can't use qWarning here (reentrancy)
                fprintf(stderr, "QT_HASH_SEED: forced seed value is not 0; ignored.\n");
            }

            // we don't have to store to the seed, since it's pre-initialized by
            // the compiler to zero
            return result;
        }
    }

    // update the full seed
    auto x = qt_initial_random_value();
    for (int i = 0; i < SeedCount; ++i) {
        seeds[i].storeRelaxed(x.data[i]);
        if (which == i)
            result.requestedSeed = x.data[i];
    }
    result.state = JustInitialized;
    return result;
#endif
}